

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

object __thiscall pybind11::getattr(pybind11 *this,handle obj,char *name)

{
  long lVar1;
  error_already_set *this_00;
  
  lVar1 = PyObject_GetAttrString(obj.m_ptr,name);
  if (lVar1 != 0) {
    *(long *)this = lVar1;
    return (object)(handle)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

inline object getattr(handle obj, const char *name) {
    PyObject *result = PyObject_GetAttrString(obj.ptr(), name);
    if (!result) { throw error_already_set(); }
    return reinterpret_steal<object>(result);
}